

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  NetPrivate *pNVar1;
  __fn *p_Var2;
  void **ppvVar3;
  undefined4 *puVar4;
  undefined8 *puVar5;
  int *piVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  void *pvVar15;
  int iVar16;
  long lVar17;
  pointer piVar18;
  int iVar19;
  pointer poVar20;
  NetPrivate *pNVar21;
  NetPrivate *pNVar22;
  NetPrivate *__ptr;
  pointer pMVar23;
  undefined8 *puVar24;
  __fn *__fn;
  ulong uVar25;
  int unaff_R15D;
  bool bVar26;
  bool bVar27;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  Mat local_e8;
  pointer local_98;
  allocator_type local_89;
  NetPrivate *local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  int local_70;
  NetPrivate *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  pointer local_48;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    pNVar21 = (NetPrivate *)&stack0xffffffffffffff78;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pNVar21,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_e8);
    piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar26 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish != piVar18;
    poVar20 = (pointer)blob_mats;
    if (bVar26) {
      lVar17 = 0;
      uVar25 = 0;
      local_38 = (pointer)blob_mats;
      do {
        pNVar1 = local_88;
        local_98 = (pointer)CONCAT44(local_98._4_4_,unaff_R15D);
        __fn = (__fn *)((long)piVar18[uVar25] * 0x48 + *(long *)local_38);
        piVar6 = *(int **)((long)&(local_88->blobs).
                                  super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            pNVar22 = *(NetPrivate **)((long)&local_88->opt + lVar17);
            pNVar21 = *(NetPrivate **)
                       ((long)&(local_88->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (pNVar21 == (NetPrivate *)0x0) {
              if (pNVar22 != (NetPrivate *)0x0) {
                free(pNVar22);
                pNVar21 = pNVar22;
              }
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar21->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
        puVar24 = (undefined8 *)((long)&pNVar1->opt + lVar17);
        *(undefined8 *)
         ((long)&(pNVar1->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + lVar17) = 0;
        *(undefined8 *)((long)puVar24 + 0xc) = 0;
        *(undefined8 *)((long)puVar24 + 0x14) = 0;
        *puVar24 = 0;
        puVar24[1] = 0;
        puVar24 = (undefined8 *)
                  ((long)&(pNVar1->layers).
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                          super__Vector_impl_data._M_finish + lVar17);
        *puVar24 = 0;
        puVar24[1] = 0;
        *(undefined4 *)
         ((long)&(pNVar1->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar17) = 0;
        if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
           (**(int **)(__fn + 8) != 1)) {
          pNVar21 = (NetPrivate *)&local_e8;
          Mat::clone(&local_e8,__fn,opt->blob_allocator,(int)opt,layer);
          pNVar22 = local_88;
          pNVar1 = (NetPrivate *)((long)&local_88->opt + lVar17);
          if (pNVar1 != (NetPrivate *)&local_e8) {
            piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = *(int **)((long)&(local_88->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                __ptr = *(NetPrivate **)((long)&local_88->opt + lVar17);
                pNVar21 = *(NetPrivate **)
                           ((long)&(local_88->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17);
                if (pNVar21 == (NetPrivate *)0x0) {
                  if (__ptr != (NetPrivate *)0x0) {
                    free(__ptr);
                    pNVar21 = __ptr;
                  }
                }
                else {
                  (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 &pNVar21->opt)->_M_impl).super__Vector_impl_data._M_start)->
                               elempack)();
                }
              }
            }
            *(undefined8 *)
             ((long)&(pNVar22->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar17) = 0;
            *(undefined8 *)
             ((long)&(pNVar1->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *(undefined8 *)
             ((long)&(pNVar1->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
            pNVar1->opt = (Option *)0x0;
            (pNVar1->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            puVar24 = (undefined8 *)
                      ((long)&(pNVar22->layers).
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish + lVar17);
            *puVar24 = 0;
            puVar24[1] = 0;
            *(undefined4 *)
             ((long)&(pNVar22->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar17) = 0;
            puVar24 = (undefined8 *)((long)&pNVar22->opt + lVar17);
            *puVar24 = local_e8.data;
            puVar24[1] = CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
            *(ulong *)((long)&(pNVar22->blobs).
                              super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                              super__Vector_impl_data._M_finish + lVar17) =
                 CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
            *(int *)((long)&(pNVar22->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar17) = local_e8.elempack;
            *(Allocator **)
             ((long)&(pNVar22->layers).
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar17) = local_e8.allocator;
            piVar6 = (int *)((long)&(pNVar22->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + lVar17);
            *piVar6 = local_e8.dims;
            piVar6[1] = local_e8.w;
            piVar6[2] = local_e8.h;
            piVar6[3] = local_e8.d;
            *(int *)((long)&(pNVar22->input_blob_indexes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar17) = local_e8.c;
            *(size_t *)
             ((long)&(pNVar22->input_blob_indexes).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + lVar17) = local_e8.cstep;
          }
          piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              pNVar21 = (NetPrivate *)local_e8.allocator;
              if ((NetPrivate *)local_e8.allocator == (NetPrivate *)0x0) {
                if ((NetPrivate *)local_e8.data != (NetPrivate *)0x0) {
                  free(local_e8.data);
                  pNVar21 = (NetPrivate *)local_e8.data;
                }
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                               &(local_e8.allocator)->_vptr_Allocator)->_M_impl).
                              super__Vector_impl_data._M_start)->elempack)();
              }
            }
          }
          local_e8.cstep = 0;
          local_e8.data = (NetPrivate *)0x0;
          local_e8.refcount._0_4_ = 0;
          local_e8.refcount._4_4_ = 0;
          local_e8.elemsize._0_4_ = 0;
          local_e8.elemsize._4_4_ = 0;
          local_e8.elempack = 0;
          local_e8.dims = 0;
          local_e8.w = 0;
          local_e8.h = 0;
          local_e8.d = 0;
          local_e8.c = 0;
          if ((*(long *)((long)&local_88->opt + lVar17) != 0) &&
             ((long)*(int *)((long)&(local_88->input_blob_indexes).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar17) *
              *(long *)((long)&(local_88->input_blob_indexes).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + lVar17) != 0)) goto LAB_0013a990;
          bVar27 = false;
          unaff_R15D = -100;
        }
        else {
LAB_0013a990:
          pNVar1 = local_88;
          if ((*(int *)((long)&(local_88->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar17) == 0) &&
             (p_Var2 = (__fn *)((long)&local_88->opt + lVar17), p_Var2 != __fn)) {
            piVar6 = *(int **)(__fn + 8);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + 1;
              UNLOCK();
            }
            piVar6 = *(int **)((long)&(local_88->blobs).
                                      super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar17);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                pNVar22 = *(NetPrivate **)((long)&local_88->opt + lVar17);
                pNVar21 = *(NetPrivate **)
                           ((long)&(local_88->layers).
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar17);
                if (pNVar21 == (NetPrivate *)0x0) {
                  if (pNVar22 != (NetPrivate *)0x0) {
                    free(pNVar22);
                    pNVar21 = pNVar22;
                  }
                }
                else {
                  (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                 &pNVar21->opt)->_M_impl).super__Vector_impl_data._M_start)->
                               elempack)();
                }
              }
            }
            puVar24 = (undefined8 *)((long)&pNVar1->opt + lVar17);
            puVar24[8] = 0;
            *(undefined8 *)(p_Var2 + 0xc) = 0;
            *(undefined8 *)(p_Var2 + 0x14) = 0;
            *(undefined8 *)p_Var2 = 0;
            *(undefined8 *)(p_Var2 + 8) = 0;
            puVar24[5] = 0;
            puVar24[6] = 0;
            *(undefined4 *)(puVar24 + 7) = 0;
            uVar10 = *(undefined8 *)(__fn + 8);
            *puVar24 = *(undefined8 *)__fn;
            puVar24[1] = uVar10;
            puVar24[2] = *(undefined8 *)(__fn + 0x10);
            *(undefined4 *)(puVar24 + 3) = *(undefined4 *)(__fn + 0x18);
            puVar24[4] = *(undefined8 *)(__fn + 0x20);
            uVar10 = *(undefined8 *)(__fn + 0x30);
            puVar24[5] = *(undefined8 *)(__fn + 0x28);
            puVar24[6] = uVar10;
            *(undefined4 *)(puVar24 + 7) = *(undefined4 *)(__fn + 0x38);
            puVar24[8] = *(undefined8 *)(__fn + 0x40);
          }
          iVar16 = convert_layout(pNVar21,(Mat *)((long)&local_88->opt + lVar17),layer,opt);
          bVar27 = iVar16 == 0;
          unaff_R15D = (int)local_98;
          if (!bVar27) {
            unaff_R15D = iVar16;
          }
        }
        poVar20 = local_38;
        if (!bVar27) break;
        uVar25 = uVar25 + 1;
        piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar17 = lVar17 + 0x48;
        bVar26 = uVar25 < (ulong)((long)(layer->bottoms).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish - (long)piVar18 >> 2);
      } while (bVar26);
    }
    if (bVar26) {
      bVar26 = false;
    }
    else {
      if ((opt->lightmode == true) && (layer->support_inplace == true)) {
        iVar16 = (*layer->_vptr_Layer[8])(layer,&stack0xffffffffffffff78,opt);
        iVar19 = iVar16;
        if ((iVar16 == 0) &&
           (piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar19 = unaff_R15D,
           (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar18)) {
          local_98 = (pointer)((ulong)local_98 & 0xffffffff00000000);
          lVar17 = 0;
          uVar25 = 0;
          do {
            pNVar21 = local_88;
            puVar24 = (undefined8 *)((long)piVar18[uVar25] * 0x48 + *(long *)poVar20);
            if ((undefined8 *)((long)&local_88->opt + lVar17) != puVar24) {
              piVar6 = *(int **)((long)&(local_88->blobs).
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar17);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = (int *)puVar24[1];
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if ((long *)puVar24[4] == (long *)0x0) {
                    if ((void *)*puVar24 != (void *)0x0) {
                      free((void *)*puVar24);
                    }
                  }
                  else {
                    (**(code **)(*(long *)puVar24[4] + 0x18))();
                  }
                }
              }
              puVar24[8] = 0;
              *puVar24 = 0;
              puVar24[1] = 0;
              *(undefined8 *)((long)puVar24 + 0xc) = 0;
              *(undefined8 *)((long)puVar24 + 0x14) = 0;
              puVar24[5] = 0;
              puVar24[6] = 0;
              *(undefined4 *)(puVar24 + 7) = 0;
              puVar5 = (undefined8 *)((long)&pNVar21->opt + lVar17);
              uVar10 = puVar5[1];
              *puVar24 = *puVar5;
              puVar24[1] = uVar10;
              puVar24[2] = *(undefined8 *)
                            ((long)&(pNVar21->blobs).
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                                    _M_impl.super__Vector_impl_data._M_finish + lVar17);
              *(undefined4 *)(puVar24 + 3) =
                   *(undefined4 *)
                    ((long)&(pNVar21->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + lVar17);
              puVar24[4] = *(undefined8 *)
                            ((long)&(pNVar21->layers).
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17);
              puVar4 = (undefined4 *)
                       ((long)&(pNVar21->layers).
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar17);
              uVar7 = puVar4[1];
              uVar8 = puVar4[2];
              uVar9 = puVar4[3];
              *(undefined4 *)(puVar24 + 5) = *puVar4;
              *(undefined4 *)((long)puVar24 + 0x2c) = uVar7;
              *(undefined4 *)(puVar24 + 6) = uVar8;
              *(undefined4 *)((long)puVar24 + 0x34) = uVar9;
              *(undefined4 *)(puVar24 + 7) =
                   *(undefined4 *)
                    ((long)&(pNVar21->input_blob_indexes).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar17);
              puVar24[8] = *(undefined8 *)
                            ((long)&(pNVar21->input_blob_indexes).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish + lVar17);
            }
            uVar25 = uVar25 + 1;
            piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x48;
          } while (uVar25 < (ulong)((long)(layer->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar18 >> 2));
          iVar16 = (int)local_98;
        }
      }
      else {
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8,
                   (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2,&local_89);
        iVar16 = (*layer->_vptr_Layer[6])(layer,&stack0xffffffffffffff78,&local_e8,opt);
        iVar19 = iVar16;
        if ((iVar16 == 0) &&
           (piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start, iVar19 = unaff_R15D,
           (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar18)) {
          local_98 = (pointer)((ulong)local_98 & 0xffffffff00000000);
          lVar17 = 0;
          uVar25 = 0;
          do {
            pvVar15 = local_e8.data;
            puVar24 = (undefined8 *)((long)piVar18[uVar25] * 0x48 + *(long *)poVar20);
            if ((undefined8 *)
                ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_e8.data)->
                        _M_impl).super__Vector_impl_data._M_start + lVar17) != puVar24) {
              piVar6 = *(int **)((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         ((long)local_e8.data + 8))->
                                        super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + lVar17);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + 1;
                UNLOCK();
              }
              piVar6 = (int *)puVar24[1];
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if ((long *)puVar24[4] == (long *)0x0) {
                    if ((void *)*puVar24 != (void *)0x0) {
                      free((void *)*puVar24);
                    }
                  }
                  else {
                    (**(code **)(*(long *)puVar24[4] + 0x18))();
                  }
                }
              }
              puVar24[8] = 0;
              *puVar24 = 0;
              puVar24[1] = 0;
              *(undefined8 *)((long)puVar24 + 0xc) = 0;
              *(undefined8 *)((long)puVar24 + 0x14) = 0;
              puVar24[5] = 0;
              puVar24[6] = 0;
              *(undefined4 *)(puVar24 + 7) = 0;
              puVar5 = (undefined8 *)
                       ((long)&(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)pvVar15)->
                               _M_impl).super__Vector_impl_data._M_start + lVar17);
              uVar10 = puVar5[1];
              *puVar24 = *puVar5;
              puVar24[1] = uVar10;
              puVar24[2] = *(undefined8 *)
                            ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                     ((long)pvVar15 + 8))->
                                    super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                    _M_impl.super__Vector_impl_data._M_finish + lVar17);
              *(undefined4 *)(puVar24 + 3) =
                   *(undefined4 *)
                    ((long)&(((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)((long)pvVar15 + 8)
                             )->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl
                            .super__Vector_impl_data._M_end_of_storage + lVar17);
              puVar24[4] = *(undefined8 *)
                            ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                     ((long)pvVar15 + 0x20))->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar17);
              puVar5 = (undefined8 *)
                       ((long)&(((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                ((long)pvVar15 + 0x20))->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish + lVar17);
              uVar10 = puVar5[1];
              puVar24[5] = *puVar5;
              puVar24[6] = uVar10;
              *(undefined4 *)(puVar24 + 7) =
                   *(undefined4 *)
                    ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar15 + 0x38))->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar17);
              puVar24[8] = *(undefined8 *)
                            ((long)&(((vector<int,_std::allocator<int>_> *)((long)pvVar15 + 0x38))->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish + lVar17);
            }
            uVar25 = uVar25 + 1;
            piVar18 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0x48;
          } while (uVar25 < (ulong)((long)(layer->tops).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar18 >> 2));
          iVar16 = (int)local_98;
        }
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_e8);
      }
      unaff_R15D = iVar19;
      if (iVar16 == 0) {
        bVar26 = true;
        if ((opt->lightmode == true) &&
           (piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
           (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish != piVar18)) {
          uVar25 = 0;
          do {
            puVar24 = (undefined8 *)(*(long *)poVar20 + (long)piVar18[uVar25] * 0x48);
            piVar6 = (int *)puVar24[1];
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if ((long *)puVar24[4] == (long *)0x0) {
                  if ((void *)*puVar24 != (void *)0x0) {
                    free((void *)*puVar24);
                  }
                }
                else {
                  (**(code **)(*(long *)puVar24[4] + 0x18))();
                }
              }
            }
            puVar24[8] = 0;
            uVar25 = uVar25 + 1;
            *puVar24 = 0;
            puVar24[1] = 0;
            *(undefined8 *)((long)puVar24 + 0xc) = 0;
            *(undefined8 *)((long)puVar24 + 0x14) = 0;
            puVar24[5] = 0;
            puVar24[6] = 0;
            *(undefined4 *)(puVar24 + 7) = 0;
            piVar18 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar25 < (ulong)((long)(layer->bottoms).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar18 >> 2));
        }
      }
      else {
        bVar26 = false;
      }
    }
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&stack0xffffffffffffff78);
    goto joined_r0x0013aea6;
  }
  lVar17 = (long)*(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
  iVar16 = *(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar18 = (pointer)(lVar17 * 9);
  pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + lVar17;
  local_e8.cstep = 0;
  local_e8.data = (NetPrivate *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8.elemsize._4_4_ = 0;
  local_e8.elempack = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar23->refcount != 1)) {
    this = (NetPrivate *)&stack0xffffffffffffff78;
    Mat::clone((Mat *)this,(__fn *)pMVar23,opt->blob_allocator,(int)opt,layer);
    piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if ((NetPrivate *)local_e8.allocator == (NetPrivate *)0x0) {
          this = (NetPrivate *)local_e8.allocator;
          if ((NetPrivate *)local_e8.data != (NetPrivate *)0x0) {
            free(local_e8.data);
            this = (NetPrivate *)local_e8.data;
          }
        }
        else {
          (**(code **)&((Option *)(local_e8.allocator)->_vptr_Allocator)->openmp_blocktime)();
          this = (NetPrivate *)local_e8.allocator;
        }
      }
    }
    piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
    local_e8.data = local_88;
    local_e8.refcount._0_4_ = uStack_80;
    local_e8.refcount._4_4_ = uStack_7c;
    local_e8.elemsize._0_4_ = local_78;
    local_e8.elemsize._4_4_ = uStack_74;
    local_e8.elempack = local_70;
    local_e8.allocator = (Allocator *)local_68;
    local_e8.dims = iStack_60;
    local_e8.w = iStack_5c;
    local_e8.h = iStack_58;
    local_e8.d = iStack_54;
    local_e8.c = iStack_50;
    local_e8.cstep = (size_t)local_48;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        this = local_68;
        if (local_68 == (NetPrivate *)0x0) {
          if (local_88 != (NetPrivate *)0x0) {
            free(local_88);
            this = local_88;
          }
        }
        else {
          (**(code **)&local_68->opt->openmp_blocktime)();
        }
      }
    }
    local_48 = (pointer)0x0;
    local_88 = (NetPrivate *)0x0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    local_70 = 0;
    iStack_60 = 0;
    iStack_5c = 0;
    iStack_58 = 0;
    iStack_54 = 0;
    iStack_50 = 0;
    unaff_R15D = -100;
    if (((NetPrivate *)local_e8.data != (NetPrivate *)0x0) &&
       ((long)local_e8.c * local_e8.cstep != 0)) goto LAB_0013afd9;
LAB_0013b23f:
    bVar26 = false;
  }
  else {
LAB_0013afd9:
    if ((local_e8.dims == 0) && (&local_e8 != pMVar23)) {
      piVar6 = pMVar23->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((NetPrivate *)local_e8.allocator == (NetPrivate *)0x0) {
            this = (NetPrivate *)local_e8.allocator;
            if ((NetPrivate *)local_e8.data != (NetPrivate *)0x0) {
              free(local_e8.data);
              this = (NetPrivate *)local_e8.data;
            }
          }
          else {
            (**(code **)&((Option *)(local_e8.allocator)->_vptr_Allocator)->openmp_blocktime)();
            this = (NetPrivate *)local_e8.allocator;
          }
        }
      }
      local_e8.data = pMVar23->data;
      local_e8.refcount._0_4_ = SUB84(pMVar23->refcount,0);
      local_e8.refcount._4_4_ = (undefined4)((ulong)pMVar23->refcount >> 0x20);
      local_e8.elemsize._0_4_ = (undefined4)pMVar23->elemsize;
      local_e8.elemsize._4_4_ = (undefined4)(pMVar23->elemsize >> 0x20);
      local_e8.elempack = pMVar23->elempack;
      local_e8.allocator = pMVar23->allocator;
      uVar11 = pMVar23->dims;
      uVar12 = pMVar23->w;
      uVar13 = pMVar23->h;
      uVar14 = pMVar23->d;
      local_e8.c = pMVar23->c;
      local_e8.cstep = pMVar23->cstep;
      local_e8.dims = uVar11;
      local_e8.w = uVar12;
      local_e8.h = uVar13;
      local_e8.d = uVar14;
    }
    unaff_R15D = convert_layout(this,&local_e8,layer,opt);
    if (unaff_R15D != 0) goto LAB_0013b23f;
    if ((opt->lightmode != true) || (layer->support_inplace != true)) {
      local_48 = (pointer)0x0;
      local_88 = (NetPrivate *)0x0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      local_70 = 0;
      local_68 = (NetPrivate *)0x0;
      iStack_60 = 0;
      iStack_5c = 0;
      iStack_58 = 0;
      iStack_54 = 0;
      iStack_50 = 0;
      local_98 = piVar18;
      unaff_R15D = (*layer->_vptr_Layer[7])(layer,&local_e8,(pointer)&stack0xffffffffffffff78);
      if (unaff_R15D == 0) {
        pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar16;
        if (pMVar23 != (pointer)&stack0xffffffffffffff78) {
          piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = pMVar23->refcount;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (pMVar23->allocator == (Allocator *)0x0) {
                if (pMVar23->data != (void *)0x0) {
                  free(pMVar23->data);
                }
              }
              else {
                (*pMVar23->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar23->cstep = 0;
          pMVar23->data = (void *)0x0;
          pMVar23->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
          pMVar23->dims = 0;
          pMVar23->w = 0;
          pMVar23->h = 0;
          pMVar23->d = 0;
          pMVar23->c = 0;
          pMVar23->data = local_88;
          pMVar23->refcount = (int *)CONCAT44(uStack_7c,uStack_80);
          pMVar23->elemsize = CONCAT44(uStack_74,local_78);
          pMVar23->elempack = local_70;
          pMVar23->allocator = (Allocator *)local_68;
          pMVar23->dims = iStack_60;
          pMVar23->w = iStack_5c;
          pMVar23->h = iStack_58;
          pMVar23->d = iStack_54;
          pMVar23->c = iStack_50;
          pMVar23->cstep = (size_t)local_48;
        }
        piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_68 == (NetPrivate *)0x0) {
              if (local_88 != (NetPrivate *)0x0) {
                free(local_88);
              }
            }
            else {
              (**(code **)&local_68->opt->openmp_blocktime)();
            }
          }
        }
        local_48 = (pointer)0x0;
        local_88 = (NetPrivate *)0x0;
        uStack_80 = 0;
        uStack_7c = 0;
        local_78 = 0;
        uStack_74 = 0;
        local_70 = 0;
        iStack_60 = 0;
        iStack_5c = 0;
        iStack_58 = 0;
        iStack_54 = 0;
        iStack_50 = 0;
        piVar18 = local_98;
        goto LAB_0013b3ff;
      }
      piVar6 = (int *)CONCAT44(uStack_7c,uStack_80);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_68 == (NetPrivate *)0x0) {
            if (local_88 != (NetPrivate *)0x0) {
              free(local_88);
            }
          }
          else {
            (**(code **)&local_68->opt->openmp_blocktime)();
          }
        }
      }
      local_48 = (pointer)0x0;
      local_88 = (NetPrivate *)0x0;
      uStack_80 = 0;
      uStack_7c = 0;
      local_78 = 0;
      uStack_74 = 0;
      local_70 = 0;
      iStack_60 = 0;
      iStack_5c = 0;
      iStack_58 = 0;
      iStack_54 = 0;
      iStack_50 = 0;
      goto LAB_0013b23f;
    }
    unaff_R15D = (*layer->_vptr_Layer[9])(layer,&local_e8,opt);
    if (unaff_R15D != 0) goto LAB_0013b23f;
    pMVar23 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar16;
    if (pMVar23 != &local_e8) {
      piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = pMVar23->refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (pMVar23->allocator == (Allocator *)0x0) {
            if (pMVar23->data != (void *)0x0) {
              free(pMVar23->data);
            }
          }
          else {
            (*pMVar23->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar23->cstep = 0;
      pMVar23->data = (void *)0x0;
      pMVar23->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar23->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar23->elemsize + 4) = 0;
      pMVar23->dims = 0;
      pMVar23->w = 0;
      pMVar23->h = 0;
      pMVar23->d = 0;
      pMVar23->c = 0;
      pMVar23->data = local_e8.data;
      pMVar23->refcount = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
      pMVar23->elemsize = CONCAT44(local_e8.elemsize._4_4_,(undefined4)local_e8.elemsize);
      pMVar23->elempack = local_e8.elempack;
      pMVar23->allocator = local_e8.allocator;
      pMVar23->dims = local_e8.dims;
      pMVar23->w = local_e8.w;
      pMVar23->h = local_e8.h;
      pMVar23->d = local_e8.d;
      pMVar23->c = local_e8.c;
      pMVar23->cstep = local_e8.cstep;
    }
LAB_0013b3ff:
    bVar26 = true;
    if (opt->lightmode == true) {
      ppvVar3 = &((blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start)->data + (long)piVar18;
      piVar6 = (int *)ppvVar3[1];
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if ((Allocator *)ppvVar3[4] == (Allocator *)0x0) {
            if (*ppvVar3 != (void *)0x0) {
              free(*ppvVar3);
            }
          }
          else {
            (*((Allocator *)ppvVar3[4])->_vptr_Allocator[3])();
          }
        }
      }
      ppvVar3[8] = (void *)0x0;
      *ppvVar3 = (void *)0x0;
      ppvVar3[1] = (int *)0x0;
      *(undefined8 *)((long)ppvVar3 + 0xc) = 0;
      *(undefined8 *)((long)ppvVar3 + 0x14) = 0;
      ppvVar3[5] = (void *)0x0;
      ppvVar3[6] = (void *)0x0;
      *(int *)(ppvVar3 + 7) = 0;
    }
  }
  piVar6 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if ((NetPrivate *)local_e8.allocator == (NetPrivate *)0x0) {
        if ((NetPrivate *)local_e8.data != (NetPrivate *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (**(code **)&((Option *)(local_e8.allocator)->_vptr_Allocator)->openmp_blocktime)();
      }
    }
  }
joined_r0x0013aea6:
  if (bVar26) {
    unaff_R15D = 0;
  }
  return unaff_R15D;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
                if (bottom_blob.empty())
                    return -100;
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        int ret = convert_layout(bottom_blob, layer, opt);
        if (ret != 0)
            return ret;

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                    if (bottom_blobs[i].empty())
                        return -100;
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            int ret = convert_layout(bottom_blobs[i], layer, opt);
            if (ret != 0)
                return ret;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}